

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::mutate_first_k<int,true,5>
          (ref<immutable::transient_rrb<int,_true,_5>_> *trrb,uint32_t k)

{
  atomic<unsigned_int> *paVar1;
  guid_type guid;
  rrb_size_table<true> *prVar2;
  uint32_t *puVar3;
  ref<immutable::rrb_details::internal_node<int,_true>_> *prVar4;
  ref<immutable::rrb_details::internal_node<int,_true>_> rVar5;
  uint uVar6;
  transient_rrb<int,_true,_5> *ptVar7;
  rrb_size_table<true> *__ptr;
  internal_node<int,_true> *__ptr_00;
  char *__function;
  leaf_node<int,_true> *temp_2;
  ulong uVar8;
  atomic<unsigned_int> *paVar9;
  rrb_size_table<true> *temp_1;
  ref<immutable::rrb_details::internal_node<int,true>> *this;
  uint32_t uVar10;
  uint32_t uVar11;
  bool bVar12;
  ref<immutable::rrb_details::internal_node<int,_true>_> temp;
  ref<immutable::rrb_details::internal_node<int,_true>_> current;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_48;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_40;
  uint local_34;
  
  ptVar7 = trrb->ptr;
  if (ptVar7 == (transient_rrb<int,_true,_5> *)0x0) {
LAB_0011bc14:
    __function = 
    "T *immutable::ref<immutable::transient_rrb<int>>::operator->() const [T = immutable::transient_rrb<int>]"
    ;
  }
  else {
    guid = ptVar7->guid;
    local_40.ptr = (internal_node<int,_true> *)(ptVar7->root).ptr;
    if (local_40.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_40.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_40.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      ptVar7 = trrb->ptr;
      if (ptVar7 == (transient_rrb<int,_true,_5> *)0x0) goto LAB_0011bc14;
    }
    this = (ref<immutable::rrb_details::internal_node<int,true>> *)&ptVar7->root;
    uVar11 = 1;
    if (ptVar7->shift != 0 && k != 0) {
      local_34 = ptVar7->cnt - 2;
      uVar10 = ptVar7->shift;
      do {
        ensure_internal_editable<int,true,5>(&local_40,guid);
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_true>_> *)this,&local_40);
        rVar5.ptr = local_40.ptr;
        if (k != uVar11) {
          if (local_40.ptr != (internal_node<int,_true> *)0x0) goto LAB_0011b97e;
LAB_0011bbde:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<int, true>>::operator->() const [T = immutable::rrb_details::internal_node<int, true>]"
          ;
          goto LAB_0011bc0a;
        }
        if (local_40.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011bbde;
        (local_40.ptr)->len = (local_40.ptr)->len + 1;
LAB_0011b97e:
        prVar2 = ((local_40.ptr)->size_table).ptr;
        if (prVar2 != (rrb_size_table<true> *)0x0) {
          if (prVar2->guid != guid) {
            uVar6 = (local_40.ptr)->len;
            __ptr = (rrb_size_table<true> *)malloc(0x90);
            __ptr->size = (uint32_t *)(__ptr + 1);
            memcpy(__ptr + 1,prVar2->size,(ulong)uVar6 << 2);
            __ptr->guid = guid;
            LOCK();
            (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
            UNLOCK();
            LOCK();
            (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i =
                 (__ptr->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
            UNLOCK();
            ((rVar5.ptr)->size_table).ptr = __ptr;
            LOCK();
            paVar1 = &prVar2->_ref_count;
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
            UNLOCK();
            if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
              free(prVar2);
            }
            paVar1 = &__ptr->_ref_count;
            LOCK();
            (paVar1->super___atomic_base<unsigned_int>)._M_i =
                 (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
            UNLOCK();
            if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
              free(__ptr);
            }
          }
          if (k == uVar11) {
            if (local_40.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011bbde;
            prVar2 = ((local_40.ptr)->size_table).ptr;
            if (prVar2 == (rrb_size_table<true> *)0x0) {
LAB_0011bbf5:
              __function = 
              "T *immutable::ref<immutable::rrb_details::rrb_size_table<true>>::operator->() const [T = immutable::rrb_details::rrb_size_table<true>]"
              ;
              goto LAB_0011bc0a;
            }
            puVar3 = prVar2->size;
            puVar3[(local_40.ptr)->len - 1] = puVar3[(local_40.ptr)->len - 2] + 0x20;
          }
          else {
            if (local_40.ptr == (internal_node<int,_true> *)0x0) goto LAB_0011bbde;
            prVar2 = ((local_40.ptr)->size_table).ptr;
            if (prVar2 == (rrb_size_table<true> *)0x0) goto LAB_0011bbf5;
            puVar3 = prVar2->size + ((local_40.ptr)->len - 1);
            *puVar3 = *puVar3 + 0x20;
          }
        }
        prVar2 = ((local_40.ptr)->size_table).ptr;
        if (prVar2 == (rrb_size_table<true> *)0x0) {
          uVar6 = local_34 >> ((byte)uVar10 & 0x1f) & 0x1f;
        }
        else {
          uVar6 = (local_40.ptr)->len - 1;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            local_34 = local_34 - prVar2->size[(local_40.ptr)->len - 2];
          }
        }
        prVar4 = (local_40.ptr)->child;
        local_48.ptr = prVar4[uVar6].ptr;
        if (local_48.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          ((local_48.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
               ((local_48.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
        }
        ref<immutable::rrb_details::internal_node<int,_true>_>::operator=(&local_40,&local_48);
        release<int>(local_48.ptr);
        this = (ref<immutable::rrb_details::internal_node<int,true>> *)(prVar4 + uVar6);
        uVar11 = uVar11 + 1;
      } while ((uVar11 <= k) && (bVar12 = uVar10 != 5, uVar10 = uVar10 - 5, bVar12));
    }
    rVar5.ptr = local_40.ptr;
    if (uVar11 != k) {
LAB_0011bbc4:
      release<int>(local_40.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_true>_> *)this;
    }
    local_48.ptr = local_40.ptr;
    if (local_40.ptr != (internal_node<int,_true> *)0x0) {
      LOCK();
      ((local_40.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_40.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      if ((local_40.ptr)->guid != guid) {
        paVar1 = &(local_40.ptr)->_ref_count;
        __ptr_00 = (internal_node<int,_true> *)calloc(1,0x98);
        uVar6 = (rVar5.ptr)->len;
        __ptr_00->len = uVar6;
        (__ptr_00->size_table).ptr = (rrb_size_table<true> *)&__ptr_00->child;
        if ((ulong)uVar6 != 0) {
          prVar2 = ((rVar5.ptr)->size_table).ptr;
          uVar8 = 0;
          do {
            *(undefined4 *)((long)&__ptr_00->child + uVar8 * 4) =
                 *(undefined4 *)((long)&prVar2->size + uVar8 * 4);
            uVar8 = uVar8 + 1;
          } while (uVar6 != uVar8);
        }
        __ptr_00->guid = guid;
        LOCK();
        (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
        UNLOCK();
        paVar9 = &__ptr_00->_ref_count;
        LOCK();
        (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i =
             (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
        UNLOCK();
        LOCK();
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        local_48.ptr = __ptr_00;
        if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(rVar5.ptr);
        }
        LOCK();
        (paVar9->super___atomic_base<unsigned_int>)._M_i =
             (paVar9->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar9->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(__ptr_00);
        }
      }
      if (local_48.ptr != (internal_node<int,_true> *)0x0) {
        (local_48.ptr)->len = (local_48.ptr)->len + 1;
        ref<immutable::rrb_details::internal_node<int,true>>::operator=
                  (this,(ref<immutable::rrb_details::leaf_node<int,_true>_> *)&local_48);
        if (local_48.ptr != (internal_node<int,_true> *)0x0) {
          LOCK();
          paVar1 = &(local_48.ptr)->_ref_count;
          (paVar1->super___atomic_base<unsigned_int>)._M_i =
               (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
          UNLOCK();
          if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
            free(local_48.ptr);
          }
        }
        goto LAB_0011bbc4;
      }
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
    ;
  }
LAB_0011bc0a:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* mutate_first_k(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, const uint32_t k)
      {
      guid_type guid = trrb->guid;
      ref<internal_node<T, atomic_ref_counting>> current = trrb->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&trrb->root;
      uint32_t index = trrb->cnt - 2;
      uint32_t shift = trrb->shift;

      // mutate all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, ensure current node is editable
        ensure_internal_editable<T, atomic_ref_counting, N>(current, guid);
        *to_set = current;

        if (i == k)
          {
          // increase width of node
          current->len++;
          }

        if (current->size_table.ptr != nullptr)
          {
          // Ensure size table is editable too
          ensure_size_table_editable<T, atomic_ref_counting, N>(current->size_table, current->len, guid);
          if (i != k)
            {
            // Tail will always be 32 long, otherwise we insert a single element only
            current->size_table->size[current->len - 1] += bits<N>::rrb_branching;
            }
          else { // increment size of last element -- will only happen if we append empties
            current->size_table->size[current->len - 1] = current->size_table->size[current->len - 2] + bits<N>::rrb_branching;
            }
          }

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &current->child[child_index];
        auto temp = current->child[child_index];
        current = temp;

        i++;
        shift -= bits<N>::rrb_bits;
        }

      // check if we need to mutate the leaf node. Very likely to happen (31/32)
      if (i == k)
        {
        ref<leaf_node<T, atomic_ref_counting>> leaf = current;
        ensure_leaf_editable<T, atomic_ref_counting, N>(leaf, guid);
        leaf->len++;
        *to_set = leaf;
        }
      return to_set;
      }